

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

decimal_fp<float> fmt::v11::detail::dragonbox::shorter_interval_case<float>(int exponent)

{
  ulong uVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  char cVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar7;
  
  if (0x1721 < exponent + 0xba9U) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/format-inl.h"
                ,0xd3,"too large exponent");
  }
  uVar6 = exponent * 0x9a209 + -0x3fe1f >> 0x15;
  uVar7 = (ulong)uVar6;
  if (0x1f - uVar6 < 0x4e) {
    cVar8 = (char)((int)(uVar6 * -0x1a934f) >> 0x13) + (char)exponent;
    uVar1 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                      (ulong)(0x1f - uVar6) * 8);
    bVar3 = 0x28 - cVar8;
    uVar11 = (uVar1 >> 0x18) + uVar1 >> (bVar3 & 0x3f);
    uVar10 = (uint)((exponent & 0xfffffffeU) != 2) +
             (int)(uVar1 - (uVar1 >> 0x19) >> (bVar3 & 0x3f));
    uVar12 = uVar11 & 0xffffffff;
    uVar4 = (uint)(uVar12 / 10);
    if ((uint)((int)(uVar12 / 10) * 10) < uVar10) {
      uVar2 = (int)(uVar1 >> (0x27U - cVar8 & 0x3f)) + 1U >> 1;
      if (exponent == -0x23) {
        uVar2 = uVar2 & 0xfffffffe;
      }
      else {
        uVar2 = uVar2 + (uVar2 < uVar10);
      }
    }
    else {
      if ((uint)uVar11 < 10) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/format-inl.h"
                    ,0x482,"");
      }
      iVar5 = (int)(uVar12 / 10);
      uVar10 = iVar5 * 0x40000000 | (uint)(iVar5 * -0x3d70a3d7) >> 2;
      uVar9 = 0;
      if (uVar10 < 0x28f5c29) {
        uVar9 = 0;
        do {
          uVar4 = uVar10;
          uVar9 = uVar9 + 2;
          uVar10 = uVar4 * 0x40000000 | uVar4 * -0x3d70a3d7 >> 2;
        } while (uVar10 < 0x28f5c29);
      }
      uVar10 = uVar4 * -0x33333333 >> 1 | (uint)((uVar4 * -0x33333333 & 1) != 0) << 0x1f;
      uVar2 = uVar10;
      if (uVar10 >= 0x1999999a) {
        uVar2 = uVar4;
      }
      uVar7 = (ulong)(uVar6 + 1 + (uVar10 < 0x1999999a | uVar9));
    }
    return (decimal_fp<float>)((ulong)uVar2 | uVar7 << 0x20);
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/format-inl.h"
              ,0x115,"k is out of range");
}

Assistant:

FMT_INLINE decimal_fp<T> shorter_interval_case(int exponent) noexcept {
  decimal_fp<T> ret_value;
  // Compute k and beta
  const int minus_k = floor_log10_pow2_minus_log10_4_over_3(exponent);
  const int beta = exponent + floor_log2_pow10(-minus_k);

  // Compute xi and zi
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);

  auto xi = cache_accessor<T>::compute_left_endpoint_for_shorter_interval_case(
      cache, beta);
  auto zi = cache_accessor<T>::compute_right_endpoint_for_shorter_interval_case(
      cache, beta);

  // If the left endpoint is not an integer, increase it
  if (!is_left_endpoint_integer_shorter_interval<T>(exponent)) ++xi;

  // Try bigger divisor
  ret_value.significand = zi / 10;

  // If succeed, remove trailing zeros if necessary and return
  if (ret_value.significand * 10 >= xi) {
    ret_value.exponent = minus_k + 1;
    ret_value.exponent += remove_trailing_zeros(ret_value.significand);
    return ret_value;
  }

  // Otherwise, compute the round-up of y
  ret_value.significand =
      cache_accessor<T>::compute_round_up_for_shorter_interval_case(cache,
                                                                    beta);
  ret_value.exponent = minus_k;

  // When tie occurs, choose one of them according to the rule
  if (exponent >= float_info<T>::shorter_interval_tie_lower_threshold &&
      exponent <= float_info<T>::shorter_interval_tie_upper_threshold) {
    ret_value.significand = ret_value.significand % 2 == 0
                                ? ret_value.significand
                                : ret_value.significand - 1;
  } else if (ret_value.significand < xi) {
    ++ret_value.significand;
  }
  return ret_value;
}